

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O2

void __thiscall
PatternAddressMapper::shift_mapping
          (PatternAddressMapper *this,int rows,
          unordered_set<AggressorAccessPattern,_std::hash<AggressorAccessPattern>,_std::equal_to<AggressorAccessPattern>,_std::allocator<AggressorAccessPattern>_>
          *aggs_to_move)

{
  _Hash_node_base *p_Var1;
  long lVar2;
  size_t sVar3;
  size_type sVar4;
  long lVar5;
  Aggressor *agg;
  _Hash_node_base __v;
  __node_base *p_Var6;
  long *plVar7;
  unordered_set<AggressorAccessPattern,_std::hash<AggressorAccessPattern>,_std::equal_to<AggressorAccessPattern>,_std::allocator<AggressorAccessPattern>_>
  *__range1;
  undefined1 local_a8 [8];
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> movable_ids;
  set<int,_std::less<int>,_std::allocator<int>_> occupied_rows;
  int local_38;
  int local_34;
  
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&occupied_rows;
  occupied_rows._M_t._M_impl._0_4_ = 0;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_a8 = (undefined1  [8])&movable_ids._M_h._M_rehash_policy._M_next_resize;
  movable_ids._M_h._M_buckets = (__buckets_ptr)0x1;
  movable_ids._M_h._M_bucket_count = 0;
  movable_ids._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  movable_ids._M_h._M_element_count._0_4_ = 0x3f800000;
  movable_ids._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  movable_ids._M_h._M_rehash_policy._4_4_ = 0;
  movable_ids._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var6 = &(aggs_to_move->_M_h)._M_before_begin;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  local_34 = rows;
  while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
    p_Var1 = p_Var6[5]._M_nxt;
    for (__v._M_nxt = p_Var6[4]._M_nxt; __v._M_nxt != p_Var1;
        __v._M_nxt = (_Hash_node_base *)((long)&(__v._M_nxt)->_M_nxt + 4)) {
      std::__detail::
      _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)local_a8,(value_type *)__v._M_nxt);
    }
  }
  plVar7 = (long *)(occupied_rows._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x1410);
  lVar5 = (long)local_34;
LAB_001338da:
  sVar3 = occupied_rows._M_t._M_impl.super__Rb_tree_header._M_node_count;
  plVar7 = (long *)*plVar7;
  if (plVar7 == (long *)0x0) {
    *(long *)(occupied_rows._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x13e8) =
         (long)(int)occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent[1]._M_color
    ;
    lVar5 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&occupied_rows);
    *(long *)(sVar3 + 0x13f0) = (long)*(int *)(lVar5 + 0x20);
    std::
    _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_a8);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &movable_ids._M_h._M_single_bucket);
    return;
  }
  if ((aggs_to_move->_M_h)._M_element_count != 0) goto code_r0x001338e9;
  goto LAB_001338fe;
code_r0x001338e9:
  sVar4 = std::
          _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_a8,(key_type_conflict *)(plVar7 + 1));
  if (sVar4 != 0) {
LAB_001338fe:
    lVar2 = plVar7[3];
    plVar7[3] = lVar2 + lVar5;
    local_38 = (int)(lVar2 + lVar5);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
    _M_insert_unique<int>
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &movable_ids._M_h._M_single_bucket,&local_38);
  }
  goto LAB_001338da;
}

Assistant:

void PatternAddressMapper::shift_mapping(int rows, const std::unordered_set<AggressorAccessPattern> &aggs_to_move) {
  std::set<int> occupied_rows;

  // collect the aggressor ID of the aggressors given in the aggs_to_move set
  std::unordered_set<AGGRESSOR_ID_TYPE> movable_ids;
  for (const auto &agg_pair : aggs_to_move) {
    for (const auto &agg : agg_pair.aggressors) {
      movable_ids.insert(agg.id);
    }
  }

  for (auto &agg_acc_patt : aggressor_to_addr) {
    // if aggs_to_move is empty, we consider it as 'move all aggressors'; otherwise we check whether the current
    // aggressor ID is in aggs_to_move prior shifting the aggressor by the given number of rows (param: rows)
    if (aggs_to_move.empty() || movable_ids.count(agg_acc_patt.first) > 0) {
      agg_acc_patt.second.row += rows;
      occupied_rows.insert(static_cast<int>(agg_acc_patt.second.row));
    }
  }

  // this works as sets are always ordered
  min_row = *occupied_rows.begin();
  max_row = *occupied_rows.rbegin();
}